

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
Validator_invalidMathMLVariables_Test::~Validator_invalidMathMLVariables_Test
          (Validator_invalidMathMLVariables_Test *this)

{
  Validator_invalidMathMLVariables_Test *this_local;
  
  ~Validator_invalidMathMLVariables_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, invalidMathMLVariables)
{
    const std::string math =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "  <apply>\n"
        "    <eq/>\n"
        "    <ci>answer</ci>\n"
        "    <partialdiff/>\n"
        "    <apply>\n"
        "      <plus/>\n"
        "      <ci>A</ci>\n"
        "      <apply>\n"
        "        <plus/>\n"
        "        <bvar>\n"
        "          <ci>new_bvar</ci>\n"
        "        </bvar>\n"
        "        <apply>\n"
        "          <plus/>\n"
        "          <ci>   </ci>\n"
        "          <apply>\n"
        "            <plus/>\n"
        "            <ci><nonsense/></ci>\n"
        "            <apply>\n"
        "              <plus/>\n"
        "              <ci/>\n"
        "              <bvar>\n"
        "                <ci>\n"
        "                  <!-- Invalid bvar -->\n"
        "                  B\n"
        "                </ci>\n"
        "              </bvar>\n"
        "            </apply>\n"
        "          </apply>\n"
        "        </apply>\n"
        "      </apply>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</math>\n";
    const std::vector<std::string> expectedIssues = {
        "Math has a 'partialdiff' element that is not a supported MathML element.",
        "Math has a 'nonsense' element that is not a supported MathML element.",
        "MathML ci element has the child text 'answer' which does not correspond with any variable names present in component 'componentName'.",
        "MathML ci element has the child text 'new_bvar' which does not correspond with any variable names present in component 'componentName'.",
        "W3C MathML DTD error: Element nonsense is not declared in ci list of possible children.",
        "W3C MathML DTD error: No declaration for element nonsense.",
        "Math has a 'eq' element without exactly two MathML siblings.",
        "Math has a 'bvar' element which first sibling is not a 'diff' element.",
        "Math has a 'ci' element with no identifier as a child.",
        "Math has a 'ci' element with no identifier as a child.",
        "Math has a 'bvar' element which first sibling is not a 'diff' element.",
    };

    libcellml::ValidatorPtr v = libcellml::Validator::create();
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();

    m->setName("modelName");
    c->setName("componentName");
    v1->setName("A");
    v2->setName("B");
    v3->setName("C");
    v1->setInitialValue("1.0");
    v2->setInitialValue("-1.0");
    v1->setUnits("dimensionless");
    v2->setUnits("dimensionless");
    v3->setUnits("dimensionless");

    c->addVariable(v1);
    c->addVariable(v2);
    c->addVariable(v3);
    c->setMath(math);
    m->addComponent(c);

    v->validateModel(m);

    EXPECT_EQ_ISSUES(expectedIssues, v);
}